

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap_stl.hpp
# Opt level: O2

void chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>
               (string *type,Module *m)

{
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this;
  allocator<char> local_2f1;
  Type_Info local_2f0;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_2d8;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_2c8;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_2b8;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_2a8;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_298;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_288;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_278;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_268;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_258;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_248;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_238;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_228;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_218;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string((string *)&local_38,type);
  local_2f0.m_type_info = (type_info *)&std::__cxx11::string::typeinfo;
  local_2f0.m_bare_type_info = (type_info *)&std::__cxx11::string::typeinfo;
  local_2f0.m_flags = 0;
  std::
  vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
  ::emplace_back<chaiscript::Type_Info&,std::__cxx11::string>
            ((vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
              *)m,&local_2f0,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  operators::addition<std::__cxx11::string>(m);
  operators::assign_sum<std::__cxx11::string>(m);
  opers_comparison<std::__cxx11::string>(m);
  random_access_container_type<std::__cxx11::string>(type,m);
  sequence_type<std::__cxx11::string>(type,m);
  default_constructible_type<std::__cxx11::string>(type,m);
  assignable_type<std::__cxx11::string>(type,m);
  input_range_type<std::__cxx11::string>(type,m);
  local_2f0.m_type_info =
       (type_info *)
       std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back;
  local_2f0.m_bare_type_info = (type_info *)0x0;
  dispatch::detail::
  make_callable_impl<void(std::__cxx11::string::*)(char),false,true,false,false,void,std::__cxx11::string&,char>
            (&local_208);
  string_type<std::__cxx11::string>(std::__cxx11::string_const&,chaiscript::Module&)::{lambda()#1}::
  operator()[abi_cxx11_(&local_58,&local_2f1);
  this = &m->m_funcs;
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_208,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_208.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<unsigned_long(std::__cxx11::string_const*,std::__cxx11::string_const&,unsigned_long),chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,chaiscript::Module&)::_lambda(std::__cxx11::string_const*,std::__cxx11::string_const&,unsigned_long)_1_>,chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,chaiscript::Module&)::_lambda(std::__cxx11::string_const*,std::__cxx11::string_const&,unsigned_long)_1_>
            ((anon_class_1_0_00000001_for_m_f *)&local_218);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"find",&local_2f1);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_218,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_218.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<unsigned_long(std::__cxx11::string_const*,std::__cxx11::string_const&,unsigned_long),chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,chaiscript::Module&)::_lambda(std::__cxx11::string_const*,std::__cxx11::string_const&,unsigned_long)_2_>,chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,chaiscript::Module&)::_lambda(std::__cxx11::string_const*,std::__cxx11::string_const&,unsigned_long)_2_>
            ((anon_class_1_0_00000001_for_m_f *)&local_228);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"rfind",&local_2f1);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_228,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_228.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<unsigned_long(std::__cxx11::string_const*,std::__cxx11::string_const&,unsigned_long),chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,chaiscript::Module&)::_lambda(std::__cxx11::string_const*,std::__cxx11::string_const&,unsigned_long)_3_>,chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,chaiscript::Module&)::_lambda(std::__cxx11::string_const*,std::__cxx11::string_const&,unsigned_long)_3_>
            ((anon_class_1_0_00000001_for_m_f *)&local_238);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"find_first_of",&local_2f1)
  ;
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_238,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_238.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<unsigned_long(std::__cxx11::string_const*,std::__cxx11::string_const&,unsigned_long),chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,chaiscript::Module&)::_lambda(std::__cxx11::string_const*,std::__cxx11::string_const&,unsigned_long)_4_>,chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,chaiscript::Module&)::_lambda(std::__cxx11::string_const*,std::__cxx11::string_const&,unsigned_long)_4_>
            ((anon_class_1_0_00000001_for_m_f *)&local_248);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"find_last_of",&local_2f1);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_248,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_248.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<unsigned_long(std::__cxx11::string_const*,std::__cxx11::string_const&,unsigned_long),chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,chaiscript::Module&)::_lambda(std::__cxx11::string_const*,std::__cxx11::string_const&,unsigned_long)_5_>,chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,chaiscript::Module&)::_lambda(std::__cxx11::string_const*,std::__cxx11::string_const&,unsigned_long)_5_>
            ((anon_class_1_0_00000001_for_m_f *)&local_258);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"find_last_not_of",&local_2f1);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_258,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_258.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<unsigned_long(std::__cxx11::string_const*,std::__cxx11::string_const&,unsigned_long),chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,chaiscript::Module&)::_lambda(std::__cxx11::string_const*,std::__cxx11::string_const&,unsigned_long)_6_>,chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,chaiscript::Module&)::_lambda(std::__cxx11::string_const*,std::__cxx11::string_const&,unsigned_long)_6_>
            ((anon_class_1_0_00000001_for_m_f *)&local_268);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"find_first_not_of",&local_2f1);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_268,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_268.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<std::__cxx11::string&(std::__cxx11::string*,char),chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,chaiscript::Module&)::_lambda(std::__cxx11::string*,char)_1_>,chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,chaiscript::Module&)::_lambda(std::__cxx11::string*,char)_1_>
            ((anon_class_1_0_00000001_for_m_f *)&local_278);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"+=",&local_2f1);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_278,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_278.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<void(std::__cxx11::string*),chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,chaiscript::Module&)::_lambda(std::__cxx11::string*)_1_>,chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,chaiscript::Module&)::_lambda(std::__cxx11::string*)_1_>
            ((anon_class_1_0_00000001_for_m_f *)&local_288);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"clear",&local_2f1);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_288,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_288.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<bool(std::__cxx11::string_const*),chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,chaiscript::Module&)::_lambda(std::__cxx11::string_const*)_1_>,chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,chaiscript::Module&)::_lambda(std::__cxx11::string_const*)_1_>
            ((anon_class_1_0_00000001_for_m_f *)&local_298);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,"empty",&local_2f1);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_298,&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_298.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<unsigned_long(std::__cxx11::string_const*),chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,chaiscript::Module&)::_lambda(std::__cxx11::string_const*)_2_>,chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,chaiscript::Module&)::_lambda(std::__cxx11::string_const*)_2_>
            ((anon_class_1_0_00000001_for_m_f *)&local_2a8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"size",&local_2f1);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_2a8,&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_2a8.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<char_const*(std::__cxx11::string_const*),chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,chaiscript::Module&)::_lambda(std::__cxx11::string_const*)_3_>,chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,chaiscript::Module&)::_lambda(std::__cxx11::string_const*)_3_>
            ((anon_class_1_0_00000001_for_m_f *)&local_2b8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,"c_str",&local_2f1);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_2b8,&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_2b8.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<char_const*(std::__cxx11::string_const*),chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,chaiscript::Module&)::_lambda(std::__cxx11::string_const*)_4_>,chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,chaiscript::Module&)::_lambda(std::__cxx11::string_const*)_4_>
            ((anon_class_1_0_00000001_for_m_f *)&local_2c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"data",&local_2f1);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_2c8,&local_1d8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_2c8.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<std::__cxx11::string(std::__cxx11::string_const*,unsigned_long,unsigned_long),chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,chaiscript::Module&)::_lambda(std::__cxx11::string_const*,unsigned_long,unsigned_long)_1_>,chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,chaiscript::Module&)::_lambda(std::__cxx11::string_const*,unsigned_long,unsigned_long)_1_>
            ((anon_class_1_0_00000001_for_m_f *)&local_2d8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"substr",&local_2f1);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_2d8,&local_1f8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_2d8.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void string_type(const std::string &type, Module &m) {
    m.add(user_type<String>(), type);
    operators::addition<String>(m);
    operators::assign_sum<String>(m);
    opers_comparison<String>(m);
    random_access_container_type<String>(type, m);
    sequence_type<String>(type, m);
    default_constructible_type<String>(type, m);
    // container_type<String>(type, m);
    assignable_type<String>(type, m);
    input_range_type<String>(type, m);

    // Special case: add push_back to string (which doesn't support other back_insertion operations
    m.add(fun(&String::push_back), []() -> std::string {
      if (typeid(typename String::value_type) == typeid(Boxed_Value)) {
        return "push_back_ref";
      } else {
        return "push_back";
      }
    }());

    m.add(fun([](const String *s, const String &f, size_t pos) { return s->find(f, pos); }), "find");
    m.add(fun([](const String *s, const String &f, size_t pos) { return s->rfind(f, pos); }), "rfind");
    m.add(fun([](const String *s, const String &f, size_t pos) { return s->find_first_of(f, pos); }), "find_first_of");
    m.add(fun([](const String *s, const String &f, size_t pos) { return s->find_last_of(f, pos); }), "find_last_of");
    m.add(fun([](const String *s, const String &f, size_t pos) { return s->find_last_not_of(f, pos); }), "find_last_not_of");
    m.add(fun([](const String *s, const String &f, size_t pos) { return s->find_first_not_of(f, pos); }), "find_first_not_of");

    m.add(fun([](String *s, typename String::value_type c) -> decltype(auto) { return (*s += c); }), "+=");

    m.add(fun([](String *s) { s->clear(); }), "clear");
    m.add(fun([](const String *s) { return s->empty(); }), "empty");
    m.add(fun([](const String *s) { return s->size(); }), "size");

    m.add(fun([](const String *s) { return s->c_str(); }), "c_str");
    m.add(fun([](const String *s) { return s->data(); }), "data");
    m.add(fun([](const String *s, size_t pos, size_t len) { return s->substr(pos, len); }), "substr");
  }